

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Set.hpp
# Opt level: O1

bool __thiscall
Lib::Set<Kernel::TermList,_Lib::DefaultHash>::contains
          (Set<Kernel::TermList,_Lib::DefaultHash> *this,TermList val)

{
  Cell *pCVar1;
  ulong uVar2;
  uint uVar3;
  uint uVar4;
  size_t i;
  long lVar5;
  Cell *pCVar6;
  bool bVar7;
  uint64_t local_8;
  
  local_8 = val._content;
  uVar3 = 0x811c9dc5;
  lVar5 = 0;
  do {
    uVar3 = (*(byte *)((long)&local_8 + lVar5) ^ uVar3) * 0x1000193;
    lVar5 = lVar5 + 1;
  } while (lVar5 != 8);
  uVar4 = 2;
  if (2 < uVar3) {
    uVar4 = uVar3;
  }
  pCVar1 = this->_entries;
  uVar2 = (ulong)uVar4 % (ulong)(uint)this->_capacity;
  uVar3 = pCVar1[uVar2].code;
  bVar7 = uVar3 != 0;
  if (bVar7) {
    pCVar6 = pCVar1 + uVar2;
    do {
      if ((uVar3 == uVar4) && ((pCVar6->value)._content == val._content)) {
        return bVar7;
      }
      pCVar6 = pCVar6 + 1;
      if (pCVar6 == this->_afterLast) {
        pCVar6 = pCVar1;
      }
      uVar3 = pCVar6->code;
      bVar7 = uVar3 != 0;
    } while (bVar7);
  }
  return bVar7;
}

Assistant:

bool contains (Val val) const
  {
    unsigned code = Hash::hash(val);
    if (code < 2) {
      code = 2;
    }
    for (Cell* cell = firstCellForCode(code);
	 ! cell->empty();
	 cell = nextCell(cell)) {
      if (cell->deleted()) {
	continue;
      }
      if (cell->code == code &&
	  Hash::equals(cell->value,val)) {
	return true;
      }
    }
    return false;
  }